

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1client.c
# Opt level: O2

void on_handshake_complete(h2o_socket_t *sock,char *err)

{
  h2o_iovec_t value;
  int iVar1;
  SSL_CIPHER *c;
  ulong uVar2;
  h2o_socket_cb UNRECOVERED_JUMPTABLE;
  SSL_SESSION *pSVar3;
  uint uVar4;
  st_h2o_socket_ssl_t *psVar5;
  st_h2o_evloop_socket_t *sock_1;
  size_t sStackY_40;
  
  psVar5 = sock->ssl;
  if (err == (char *)0x0) {
    if (psVar5->ptls == (ptls_t *)0x0) {
      c = SSL_get_current_cipher((SSL *)psVar5->ossl);
      uVar2 = SSL_CIPHER_get_id(c);
      sStackY_40 = 0x1d;
      if ((3 < (int)uVar2 + 0xfcffff64U) &&
         ((uVar4 = (int)uVar2 + 0xfcff3fd5, 5 < uVar4 || ((0x33U >> (uVar4 & 0x1f) & 1) == 0)))) {
        sStackY_40 = 0x20;
      }
    }
    else {
      sStackY_40 = ptls_get_record_overhead(psVar5->ptls);
    }
    psVar5 = sock->ssl;
    psVar5->record_overhead = sStackY_40;
  }
  if (psVar5->ossl != (SSL *)0x0) {
    iVar1 = SSL_is_server();
    psVar5 = sock->ssl;
    if ((iVar1 == 0) && ((psVar5->handshake).field_1.client.session_cache != (h2o_cache_t *)0x0)) {
      if ((err != (char *)0x0) && (h2o_socket_error_ssl_cert_name_mismatch != err)) {
        UNRECOVERED_JUMPTABLE = (psVar5->handshake).cb;
        (sock->_cb).write = (h2o_socket_cb)0x0;
        (psVar5->handshake).cb = (h2o_socket_cb)0x0;
        goto LAB_00130382;
      }
      pSVar3 = SSL_get1_session((SSL *)psVar5->ossl);
      psVar5 = sock->ssl;
      value.len = 1;
      value.base = (char *)pSVar3;
      h2o_cache_set((psVar5->handshake).field_1.client.session_cache,(sock[1].ssl)->record_overhead,
                    (psVar5->handshake).field_1.client.session_cache_key,
                    (psVar5->handshake).field_1.client.session_cache_key_hash,value);
      psVar5 = sock->ssl;
    }
  }
  UNRECOVERED_JUMPTABLE = (psVar5->handshake).cb;
  (sock->_cb).write = (h2o_socket_cb)0x0;
  (psVar5->handshake).cb = (h2o_socket_cb)0x0;
  if (err == (char *)0x0) {
    decode_ssl_input(sock);
  }
LAB_00130382:
  (*UNRECOVERED_JUMPTABLE)(sock,err);
  return;
}

Assistant:

static void on_handshake_complete(h2o_socket_t *sock, const char *err)
{
    struct st_h2o_http1client_private_t *client = sock->data;

    h2o_timeout_unlink(&client->_timeout);

    if (err == NULL) {
        /* success */
    } else if (err == h2o_socket_error_ssl_cert_name_mismatch &&
               (SSL_CTX_get_verify_mode(client->super.ctx->ssl_ctx) & SSL_VERIFY_PEER) == 0) {
        /* peer verification skipped */
    } else {
        on_connect_error(client, err);
        return;
    }

    on_connection_ready(client);
}